

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::
SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
::
emplace_back<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
          (SmallVectorBase<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
           *this,span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>
                 *args)

{
  iterator psVar1;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *args_local;
  SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
  *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    psVar1 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             ::end((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                    *)this);
    this_local = (SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                  *)emplaceRealloc<nonstd::span_lite::span<slang::ast::CoverageBinSymbol::TransRangeList_const,18446744073709551615ul>>
                              (this,psVar1,args);
  }
  else {
    psVar1 = SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
             ::end((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                    *)this);
    psVar1->data_ = args->data_;
    psVar1->size_ = args->size_;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                  *)SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                    ::back((SmallVectorBase<nonstd::span_lite::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>_>
                            *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }